

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O1

ssize_t __thiscall
SocketPP::TCPClient::send(TCPClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  void *__src;
  ulong __n_00;
  ssize_t sVar1;
  undefined7 uVar2;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  undefined1 uVar3;
  undefined4 local_30 [2];
  ulong local_28;
  void *pvStack_20;
  
  uVar2 = (undefined7)(__n >> 8);
  local_30[0] = 0;
  pvStack_20 = (void *)0x0;
  __src = *(void **)CONCAT44(in_register_00000034,__fd);
  __n_00 = ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
  uVar3 = __n_00 != 0;
  if (__src != (void *)0x0 && (bool)uVar3) {
    local_28 = __n_00;
    pvStack_20 = operator_new__(__n_00);
    memcpy(pvStack_20,__src,__n_00);
    __buf = extraout_RDX;
  }
  else {
    local_28 = 0;
    pvStack_20 = (void *)0x0;
  }
  sVar1 = send(this,(int)local_30,__buf,CONCAT71(uVar2,uVar3),__flags);
  if (pvStack_20 != (void *)0x0) {
    operator_delete__(pvStack_20);
  }
  return sVar1;
}

Assistant:

ssize_t TCPClient::send(const std::string& str) {
    return send(Message(str));
}